

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_4U>::getUNORM
          (ImageT<unsigned_char,_4U> *this,uint32_t numChannels,uint32_t targetBits,uint32_t sBits)

{
  uint32_t uVar1;
  allocator_type *__a;
  uchar *puVar2;
  uint *puVar3;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int in_R8D;
  uint32_t outValue_2;
  uint16_t outValue_1;
  uint8_t outValue;
  uchar *target;
  uint32_t value;
  uchar sourceValue;
  uint32_t c;
  uint32_t x;
  uint32_t y;
  uint32_t mask;
  uint32_t targetBytes;
  uint32_t sourceBits;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  undefined1 *__n;
  uint32_t rawBits;
  undefined3 in_stack_ffffffffffffff84;
  undefined4 uVar4;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined1 local_2a;
  undefined1 local_29;
  uint32_t local_28;
  uint local_24;
  undefined4 local_20;
  uint local_14;
  
  if (4 < in_EDX) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x325,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  uVar4 = CONCAT13(1,in_stack_ffffffffffffff84);
  if ((in_ECX != 8) && (uVar4 = CONCAT13(1,in_stack_ffffffffffffff84), in_ECX != 0x10)) {
    uVar4 = CONCAT13(in_ECX == 0x20,in_stack_ffffffffffffff84);
  }
  if ((char)((uint)uVar4 >> 0x18) == '\0') {
    __assert_fail("targetBits == 8 || targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x326,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 4>::getUNORM(uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 4]"
                 );
  }
  local_20 = 8;
  local_24 = in_ECX >> 3;
  if (in_R8D == 0) {
    rawBits = 0xffffffff;
  }
  else {
    rawBits = (1 << ((byte)in_R8D & 0x1f)) + -1 << ((char)in_ECX - (byte)in_R8D & 0x1f);
  }
  local_29 = 0;
  __a = (allocator_type *)(ulong)(*(int *)(in_RSI + 0xc) * *(int *)(in_RSI + 8) * in_EDX * local_24)
  ;
  __n = &local_2a;
  local_28 = rawBits;
  local_14 = in_EDX;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x157558);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,rawBits),
             (size_type)__n,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x157578);
  for (local_40 = 0; local_40 < *(uint *)(in_RSI + 0xc); local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < *(uint *)(in_RSI + 8); local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < local_14; local_48 = local_48 + 1) {
        if (local_48 < 4) {
          color<unsigned_char,_4U>::operator[]
                    ((color<unsigned_char,_4U> *)
                     (*(long *)(in_RSI + 0x18) +
                     (ulong)(local_40 * *(int *)(in_RSI + 8) + local_44) * 4),local_48);
        }
        else {
          color_base<unsigned_char,_4U>::one();
        }
        uVar1 = imageio::convertUNORM(rawBits,(uint32_t)((ulong)__n >> 0x20),(uint32_t)__n);
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15766a);
        puVar3 = (uint *)(puVar2 + (local_40 * *(int *)(in_RSI + 8) * local_14 + local_44 * local_14
                                   + local_48) * local_24);
        if (local_24 == 1) {
          *(byte *)puVar3 = (byte)uVar1 & (byte)local_28;
        }
        else if (local_24 == 2) {
          *(ushort *)puVar3 = (ushort)uVar1 & (ushort)local_28;
        }
        else if (local_24 == 4) {
          *puVar3 = uVar1 & local_28;
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

virtual std::vector<uint8_t> getUNORM(uint32_t numChannels, uint32_t targetBits, uint32_t sBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 8 || targetBits == 16 || targetBits == 32);

        const uint32_t sourceBits = sizeof(componentType) * 8;
        const uint32_t targetBytes = targetBits / 8;
        const uint32_t mask = (sBits == 0) ? 0xFFFFFFFF : ((1u << sBits) - 1u) << (targetBits - sBits);
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto sourceValue = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : Color::one());
                    const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, targetBits);
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (targetBytes == 1) {
                        const auto outValue = static_cast<uint8_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 2) {
                        const auto outValue = static_cast<uint16_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<uint32_t>(value & mask);
                        std::memcpy(target, &outValue, sizeof(outValue));
                    }
                }
            }
        }

        return data;
    }